

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

optional<CService> * GetLocalAddrForPeer(optional<CService> *__return_storage_ptr__,CNode *node)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  Network net;
  iterator iVar3;
  uint64_t uVar4;
  Logger *this;
  int bits;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  FastRandomContext rng;
  direct_or_indirect local_78;
  uint local_68;
  Network local_60;
  uint32_t uStack_5c;
  uint16_t local_58;
  CService local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetLocalAddress((CService *)&local_78.indirect_contents,node);
  FastRandomContext::FastRandomContext(&rng,false);
  CNode::GetAddrLocal(&local_50,node);
  if (fDiscover == true) {
    bVar2 = CNetAddr::IsRoutable((CNetAddr *)&node->addr);
    if (!bVar2) goto LAB_0019babf;
    bVar2 = CNetAddr::IsRoutable(&local_50.super_CNetAddr);
    if (!bVar2) goto LAB_0019babf;
    net = CNetAddr::GetNetwork(&local_50.super_CNetAddr);
    bVar2 = ReachableNets::Contains(&g_reachable_nets,net);
  }
  else {
LAB_0019babf:
    bVar2 = false;
  }
  if (0x10 < local_50.super_CNetAddr.m_addr._size) {
    free(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect);
  }
  if (bVar2 != false) {
    bVar2 = CNetAddr::IsRoutable((CNetAddr *)&local_78.indirect_contents);
    if (bVar2) {
      local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)&g_maplocalhost_mutex;
      local_50.super_CNetAddr.m_addr._union.direct[8] = '\0';
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_50);
      iVar3 = std::
              _Rb_tree<CNetAddr,_std::pair<const_CNetAddr,_LocalServiceInfo>,_std::_Select1st<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_std::less<CNetAddr>,_std::allocator<std::pair<const_CNetAddr,_LocalServiceInfo>_>_>
              ::find(&mapLocalHost._M_t,(key_type *)&local_78.indirect_contents);
      if ((_Rb_tree_header *)iVar3._M_node == &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_50);
        bits = 1;
      }
      else {
        _Var1 = iVar3._M_node[2]._M_color;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_50);
        bits = (uint)(4 < (int)_Var1) * 2 + 1;
      }
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&rng.super_RandomMixin<FastRandomContext>,bits);
      if (uVar4 != 0) goto LAB_0019bc24;
    }
    if (node->m_conn_type == INBOUND) {
      CNode::GetAddrLocal(&local_50,node);
      if (0x10 < local_68) {
        free(local_78.indirect_contents.indirect);
      }
      local_78._8_8_ =
           CONCAT71(local_50.super_CNetAddr.m_addr._union._9_7_,
                    local_50.super_CNetAddr.m_addr._union.direct[8]);
      local_78.indirect_contents.indirect =
           local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect;
      local_68 = local_50.super_CNetAddr.m_addr._size;
      local_60 = local_50.super_CNetAddr.m_net;
      uStack_5c = local_50.super_CNetAddr.m_scope_id;
      local_58 = local_50.port;
    }
    else {
      CNode::GetAddrLocal(&local_50,node);
      CNetAddr::SetIP((CNetAddr *)&local_78.indirect_contents,&local_50.super_CNetAddr);
      if (0x10 < local_50.super_CNetAddr.m_addr._size) {
        free(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      }
    }
  }
LAB_0019bc24:
  bVar2 = CNetAddr::IsRoutable((CNetAddr *)&local_78.indirect_contents);
  if (bVar2) {
    this = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this,NET,Debug);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_
                ((string *)&local_50,(CService *)&local_78.indirect_contents);
      logging_function._M_str = "GetLocalAddrForPeer";
      logging_function._M_len = 0x13;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      LogPrintf_<std::__cxx11::string,long>
                (logging_function,source_file,0x104,
                 I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|SELECTCOINS|
                 ESTIMATEFEE|WALLETDB|ZMQ|BENCH|HTTP|NET,(Level)&local_50,&stack0xfffffffffffffef8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node->id,
                 (long *)rng.super_RandomMixin<FastRandomContext>.bitbuf);
      if ((size_type *)local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
          &local_50.super_CNetAddr.m_addr._size) {
        operator_delete(local_50.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                        CONCAT44(local_50.super_CNetAddr.m_addr._20_4_,
                                 local_50.super_CNetAddr.m_addr._size) + 1);
      }
    }
    *(char **)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
               super__Optional_payload<CService,_true,_false,_false>.
               super__Optional_payload_base<CService>._M_payload =
         local_78.indirect_contents.indirect;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 8) = local_78._8_8_;
    *(uint *)((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>).
                     _M_payload.super__Optional_payload<CService,_true,_false,_false>.
                     super__Optional_payload_base<CService>._M_payload + 0x10) = local_68;
    local_68 = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
             super__Optional_payload<CService,_true,_false,_false>.
             super__Optional_payload_base<CService>._M_payload + 0x18) = _local_60;
    (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
    super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
    _M_payload._M_value.port = local_58;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  (__return_storage_ptr__->super__Optional_base<CService,_false,_false>)._M_payload.
  super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>.
  _M_engaged = bVar2;
  ChaCha20::~ChaCha20(&rng.rng);
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CService> GetLocalAddrForPeer(CNode& node)
{
    CService addrLocal{GetLocalAddress(node)};
    // If discovery is enabled, sometimes give our peer the address it
    // tells us that it sees us as in case it has a better idea of our
    // address than we do.
    FastRandomContext rng;
    if (IsPeerAddrLocalGood(&node) && (!addrLocal.IsRoutable() ||
         rng.randbits((GetnScore(addrLocal) > LOCAL_MANUAL) ? 3 : 1) == 0))
    {
        if (node.IsInboundConn()) {
            // For inbound connections, assume both the address and the port
            // as seen from the peer.
            addrLocal = CService{node.GetAddrLocal()};
        } else {
            // For outbound connections, assume just the address as seen from
            // the peer and leave the port in `addrLocal` as returned by
            // `GetLocalAddress()` above. The peer has no way to observe our
            // listening port when we have initiated the connection.
            addrLocal.SetIP(node.GetAddrLocal());
        }
    }
    if (addrLocal.IsRoutable()) {
        LogDebug(BCLog::NET, "Advertising address %s to peer=%d\n", addrLocal.ToStringAddrPort(), node.GetId());
        return addrLocal;
    }
    // Address is unroutable. Don't advertise.
    return std::nullopt;
}